

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIDoubleDecoder::decode(FIDoubleDecoder *this,uint8_t *data,size_t len)

{
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar1;
  pointer local_b0;
  double f;
  longlong v;
  longlong b7;
  longlong b6;
  longlong b5;
  longlong b4;
  longlong b3;
  longlong b2;
  longlong b1;
  longlong b0;
  size_t i;
  size_t numDoubles;
  vector<double,_std::allocator<double>_> value;
  size_t len_local;
  uint8_t *data_local;
  FIDoubleDecoder *this_local;
  
  if ((in_RCX & 7) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&numDoubles);
  i = in_RCX >> 3;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)&numDoubles,i);
  len_local = len;
  for (b0 = 0; (ulong)b0 < i; b0 = b0 + 1) {
    b1 = (longlong)*(byte *)len_local;
    b2 = (longlong)*(byte *)(len_local + 1);
    b3 = (longlong)*(byte *)(len_local + 2);
    b4 = (longlong)*(byte *)(len_local + 3);
    b5 = (longlong)*(byte *)(len_local + 4);
    b6 = (longlong)*(byte *)(len_local + 5);
    b7 = (longlong)*(byte *)(len_local + 6);
    v = (longlong)*(byte *)(len_local + 7);
    local_b0 = (pointer)(b1 << 0x38 | b2 << 0x30 | b3 << 0x28 | b4 << 0x20 | b5 << 0x18 | b6 << 0x10
                         | b7 << 8 | v);
    f = (double)local_b0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&numDoubles,
               (value_type_conflict7 *)&stack0xffffffffffffff50);
    len_local = len_local + 8;
  }
  FIDoubleValue::create
            ((FIDoubleValue *)&stack0xffffffffffffff40,
             (vector<double,_std::allocator<double>_> *)&numDoubles);
  std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FIDoubleValue,void>
            ((shared_ptr<Assimp::FIValue_const> *)this,
             (shared_ptr<Assimp::FIDoubleValue> *)&stack0xffffffffffffff40);
  std::shared_ptr<Assimp::FIDoubleValue>::~shared_ptr
            ((shared_ptr<Assimp::FIDoubleValue> *)&stack0xffffffffffffff40);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&numDoubles);
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 7) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<double> value;
        size_t numDoubles = len / 8;
        value.reserve(numDoubles);
        for (size_t i = 0; i < numDoubles; ++i) {
            long long b0 = data[0], b1 = data[1], b2 = data[2], b3 = data[3], b4 = data[4], b5 = data[5], b6 = data[6], b7 = data[7];
            long long v = (b0 << 56) | (b1 << 48) | (b2 << 40) | (b3 << 32) | (b4 << 24) | (b5 << 16) | (b6 << 8) | b7;
            double f;
            memcpy(&f, &v, 8);
            value.push_back(f);
            data += 8;
        }
        return FIDoubleValue::create(std::move(value));
    }